

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.cpp
# Opt level: O2

void rw::writePNG(Image *image,char *filename)

{
  uint32 srcstride;
  int iVar1;
  uint code;
  undefined4 extraout_var;
  uint8 *puVar2;
  char *pcVar3;
  LodePNGState *e;
  FILE *__stream;
  long lVar4;
  uint8 *raw;
  uint8 *local_250;
  size_t rawsize;
  StreamFile local_240;
  Error _e_1;
  LodePNGState state;
  
  local_240.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00142c08;
  local_240.file = (void *)0x0;
  iVar1 = StreamFile::open(&local_240,filename,0x12d08b);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    e = &state;
    state.decoder.zlibsettings.ignore_adler32 = 0;
    state.decoder.zlibsettings.ignore_nlen = 0x80000003;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/png.cpp",0x58);
    __stream = _stderr;
    pcVar3 = dbgsprint(0x80000003,filename);
  }
  else {
    raw = (uint8 *)0x0;
    lodepng_state_init(&state);
    puVar2 = image->pixels;
    iVar1 = image->depth;
    switch(iVar1 << 0x1e | iVar1 - 4U >> 2) {
    case 0:
      state.info_raw.colortype = LCT_PALETTE;
      state.info_raw.bitdepth = 4;
      state.info_png.color.colortype = LCT_PALETTE;
      state.info_png.color.bitdepth = 4;
      state.encoder.auto_convert = 0;
      for (lVar4 = 0; lVar4 < 1 << ((byte)iVar1 & 0x1f); lVar4 = lVar4 + 1) {
        puVar2 = image->palette;
        lodepng_palette_add(&state.info_png.color,puVar2[lVar4 * 4],puVar2[lVar4 * 4 + 1],
                            puVar2[lVar4 * 4 + 2],puVar2[lVar4 * 4 + 3]);
        lodepng_palette_add(&state.info_raw,puVar2[lVar4 * 4],puVar2[lVar4 * 4 + 1],
                            puVar2[lVar4 * 4 + 2],puVar2[lVar4 * 4 + 3]);
        iVar1 = image->depth;
      }
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/png.cpp line: 111"
      ;
      puVar2 = (uint8 *)(*DAT_00143848)((long)(image->width / 2) * (long)image->height,0x10018,
                                        (long)image->width % 2 & 0xffffffff);
      srcstride = image->width;
      compressPal4_BE(puVar2,(int)srcstride / 2,image->pixels,srcstride,srcstride,image->height);
      break;
    case 1:
      state.info_raw.colortype = LCT_PALETTE;
      state.info_png.color.colortype = LCT_PALETTE;
      state.encoder.auto_convert = 0;
      local_250 = puVar2;
      for (lVar4 = 0; puVar2 = local_250, lVar4 < 1 << ((byte)iVar1 & 0x1f); lVar4 = lVar4 + 1) {
        puVar2 = image->palette;
        lodepng_palette_add(&state.info_png.color,puVar2[lVar4 * 4],puVar2[lVar4 * 4 + 1],
                            puVar2[lVar4 * 4 + 2],puVar2[lVar4 * 4 + 3]);
        lodepng_palette_add(&state.info_raw,puVar2[lVar4 * 4],puVar2[lVar4 * 4 + 1],
                            puVar2[lVar4 * 4 + 2],puVar2[lVar4 * 4 + 3]);
        iVar1 = image->depth;
      }
      break;
    case 3:
      Image::convertTo32(image);
      break;
    case 5:
      state.info_raw.colortype = LCT_RGB;
      state.info_png.color.colortype = LCT_RGB;
      state.encoder.auto_convert = 0;
    }
    code = lodepng_encode(&raw,&rawsize,puVar2,image->width,image->height,&state);
    if (code == 0) {
      if (puVar2 != image->pixels) {
        (*DAT_00143840)(puVar2);
      }
      puVar2 = raw;
      StreamFile::write8(&local_240,raw,(uint32)rawsize);
      StreamFile::close(&local_240,(int)puVar2);
      free(raw);
      return;
    }
    e = (LodePNGState *)&_e_1;
    _e_1.plugin = 0;
    _e_1.code = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/png.cpp",0x8d);
    __stream = _stderr;
    pcVar3 = lodepng_error_text(code);
    pcVar3 = dbgsprint(0x80000001,pcVar3);
  }
  fprintf(__stream,"%s\n",pcVar3);
  setError((Error *)e);
  return;
}

Assistant:

void
writePNG(Image *image, const char *filename)
{
	int32 i;
	StreamFile file;
	if(!file.open(filename, "wb")){
		RWERROR((ERR_FILE, filename));
		return;
	}

	size_t rawsize;
	uint8 *raw = nil;
	uint8 *pixels;
	LodePNGState state;
	lodepng_state_init(&state);

	pixels = image->pixels;
	switch(image->depth){
	case 4:
		state.info_raw.bitdepth = 4;
		state.info_raw.colortype = LCT_PALETTE;
		state.info_png.color.bitdepth = 4;
		state.info_png.color.colortype = LCT_PALETTE;
		state.encoder.auto_convert = 0;
		for(i = 0; i < (1<<image->depth); i++){
			uint8 *col = &image->palette[i*4];
			lodepng_palette_add(&state.info_png.color, col[0], col[1], col[2], col[3]);
			lodepng_palette_add(&state.info_raw, col[0], col[1], col[2], col[3]);
		}
		pixels = rwNewT(uint8, image->width/2*image->height, ID_IMAGE | MEMDUR_FUNCTION);
		compressPal4_BE(pixels, image->width/2, image->pixels, image->width, image->width, image->height);
		break;
	case 8:
		state.info_raw.colortype = LCT_PALETTE;
		state.info_png.color.colortype = LCT_PALETTE;
		state.encoder.auto_convert = 0;
		for(i = 0; i < (1<<image->depth); i++){
			uint8 *col = &image->palette[i*4];
			lodepng_palette_add(&state.info_png.color, col[0], col[1], col[2], col[3]);
			lodepng_palette_add(&state.info_raw, col[0], col[1], col[2], col[3]);
		}
		break;
	case 16:
		// Don't think we can have 16 bits with PNG
		// TODO: don't change original image
		image->convertTo32();
		break;
	case 24:
		state.info_raw.colortype = LCT_RGB;
		state.info_png.color.colortype = LCT_RGB;
		state.encoder.auto_convert = 0;
		break;
	case 32:
		// already done
		break;
	}

	uint32 error = lodepng_encode(&raw, &rawsize, pixels, image->width, image->height, &state);
	if(error){
		RWERROR((ERR_GENERAL, lodepng_error_text(error)));
		return;
	}
	if(pixels != image->pixels)
		rwFree(pixels);
	file.write8(raw, rawsize);
	file.close();
	free(raw);
}